

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::java::anon_unknown_0::MessageHasConflictingClassName
          (anon_unknown_0 *this,Descriptor *message,string_view classname,NameEquality equality_mode
          )

{
  string_view sVar1;
  string_view sVar2;
  bool bVar3;
  NameEquality NVar4;
  int iVar5;
  DescriptorStringView psVar6;
  Descriptor *this_00;
  EnumDescriptor *this_01;
  string_view classname_00;
  int local_6c;
  int i_1;
  int local_54;
  int i;
  NameEquality equality_mode_local;
  Descriptor *message_local;
  string_view classname_local;
  
  psVar6 = Descriptor::name_abi_cxx11_((Descriptor *)this);
  sVar2 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
  sVar1._M_str = (char *)classname._M_len;
  sVar1._M_len = (size_t)message;
  NVar4 = CheckNameEquality(sVar2,sVar1);
  if (NVar4 == (NameEquality)classname._M_str) {
    classname_local._M_str._7_1_ = true;
  }
  else {
    for (local_54 = 0; iVar5 = Descriptor::nested_type_count((Descriptor *)this), local_54 < iVar5;
        local_54 = local_54 + 1) {
      this_00 = Descriptor::nested_type((Descriptor *)this,local_54);
      classname_00._M_str._4_4_ = 0;
      classname_00._0_12_ = classname._0_12_;
      bVar3 = MessageHasConflictingClassName
                        ((anon_unknown_0 *)this_00,message,classname_00,equality_mode);
      if (bVar3) {
        return true;
      }
    }
    for (local_6c = 0; iVar5 = Descriptor::enum_type_count((Descriptor *)this), local_6c < iVar5;
        local_6c = local_6c + 1) {
      this_01 = Descriptor::enum_type((Descriptor *)this,local_6c);
      psVar6 = EnumDescriptor::name_abi_cxx11_(this_01);
      sVar1 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
      sVar2._M_str = (char *)classname._M_len;
      sVar2._M_len = (size_t)message;
      NVar4 = CheckNameEquality(sVar1,sVar2);
      if (NVar4 == (NameEquality)classname._M_str) {
        return true;
      }
    }
    classname_local._M_str._7_1_ = false;
  }
  return classname_local._M_str._7_1_;
}

Assistant:

bool MessageHasConflictingClassName(const Descriptor* message,
                                    absl::string_view classname,
                                    NameEquality equality_mode) {
  if (CheckNameEquality(message->name(), classname) == equality_mode) {
    return true;
  }
  for (int i = 0; i < message->nested_type_count(); ++i) {
    if (MessageHasConflictingClassName(message->nested_type(i), classname,
                                       equality_mode)) {
      return true;
    }
  }
  for (int i = 0; i < message->enum_type_count(); ++i) {
    if (CheckNameEquality(message->enum_type(i)->name(), classname) ==
        equality_mode) {
      return true;
    }
  }
  return false;
}